

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canal.cc
# Opt level: O0

void search<OffsetFreeSymbolMatcher,unsigned_long>
               (csptr *view,OffsetFreeSymbolMatcher *m,Addr loc,AddressRanges *searchaddrs,
               SymbolStore *store,bool showaddrs)

{
  ulong uVar1;
  unsigned_long uVar2;
  bool bVar3;
  element_type *reader_;
  size_type sVar4;
  unsigned_long *puVar5;
  ostream *poVar6;
  void *pvVar7;
  difference_type dVar8;
  __tuple_element_t<0UL,_tuple<bool,_ListedSymbol_*>_> *p_Var9;
  __tuple_element_t<1UL,_tuple<bool,_ListedSymbol_*>_> *ppLVar10;
  Off OVar11;
  iterator iVar12;
  exception *ex;
  type *sym;
  type_conflict *found;
  unsigned_long p_1;
  iterator cur_1;
  pair<unsigned_long,_unsigned_long> *range;
  const_iterator __end4;
  const_iterator __begin4;
  AddressRanges *__range4;
  unsigned_long p;
  iterator cur;
  iterator start;
  ReaderArray<unsigned_long,_131072UL> r;
  undefined1 local_148 [8];
  IOFlagSave _;
  bool showaddrs_local;
  SymbolStore *store_local;
  AddressRanges *searchaddrs_local;
  Addr loc_local;
  OffsetFreeSymbolMatcher *m_local;
  csptr *view_local;
  
  _._271_1_ = showaddrs;
  pstack::IOFlagSave::IOFlagSave
            ((IOFlagSave *)local_148,(ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  reader_ = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)view);
  pstack::ReaderArray<unsigned_long,_131072UL>::ReaderArray
            ((ReaderArray<unsigned_long,_131072UL> *)&start.idx,reader_,0);
  iVar12 = pstack::ReaderArray<unsigned_long,_131072UL>::begin
                     ((ReaderArray<unsigned_long,_131072UL> *)&start.idx);
  start.arrayp = (ReaderArray<unsigned_long,_131072UL> *)iVar12.idx;
  sVar4 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size(searchaddrs);
  if (sVar4 == 0) {
    cur_1.arrayp = start.arrayp;
    while( true ) {
      pstack::ReaderArray<unsigned_long,_131072UL>::end
                ((ReaderArray<unsigned_long,_131072UL> *)&start.idx);
      bVar3 = pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator!=
                        ((iterator *)&stack0xffffffffffeffe20,(sentinel *)((long)&p_1 + 7));
      if (!bVar3) break;
      puVar5 = pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator*
                         ((iterator *)&stack0xffffffffffeffe20);
      uVar2 = *puVar5;
      SymbolStore::find<OffsetFreeSymbolMatcher>
                ((SymbolStore *)&stack0xffffffffffeffe00,store,uVar2);
      p_Var9 = std::get<0ul,bool,ListedSymbol*>
                         ((tuple<bool,_ListedSymbol_*> *)&stack0xffffffffffeffe00);
      ppLVar10 = std::get<1ul,bool,ListedSymbol*>
                           ((tuple<bool,_ListedSymbol_*> *)&stack0xffffffffffeffe00);
      if ((*p_Var9 & 1U) != 0) {
        if ((_._271_1_ & 1) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,(string *)&(*ppLVar10)->name);
          poVar6 = std::operator<<(poVar6," 0x");
          pvVar7 = (void *)std::ostream::operator<<(poVar6,std::hex);
          dVar8 = pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator-
                            ((iterator *)&stack0xffffffffffeffe20,(iterator *)&cur.idx);
          pvVar7 = (void *)std::ostream::operator<<(pvVar7,loc + dVar8 * 8);
          poVar6 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
          poVar6 = std::operator<<(poVar6," ... size=");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,((*ppLVar10)->sym).st_size);
          poVar6 = std::operator<<(poVar6,", diff=");
          OVar11 = ListedSymbol::memaddr(*ppLVar10);
          pvVar7 = (void *)std::ostream::operator<<(poVar6,uVar2 - OVar11);
          std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        }
        (*ppLVar10)->count = (*ppLVar10)->count + 1;
      }
      pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator++
                ((iterator *)&stack0xffffffffffeffe20);
    }
  }
  else {
    cur.arrayp = start.arrayp;
    while( true ) {
      pstack::ReaderArray<unsigned_long,_131072UL>::end
                ((ReaderArray<unsigned_long,_131072UL> *)&start.idx);
      bVar3 = pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator!=
                        ((iterator *)&stack0xffffffffffeffe60,(sentinel *)((long)&p + 7));
      if (!bVar3) break;
      puVar5 = pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator*
                         ((iterator *)&stack0xffffffffffeffe60);
      uVar1 = *puVar5;
      __end4 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::begin(searchaddrs);
      range = (pair<unsigned_long,_unsigned_long> *)
              std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::end(searchaddrs);
      while (bVar3 = __gnu_cxx::
                     operator==<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                               (&__end4,(__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                         *)&range), ((bVar3 ^ 0xffU) & 1) != 0) {
        cur_1.idx = (size_t)__gnu_cxx::
                            __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                            ::operator*(&__end4);
        if ((((reference)cur_1.idx)->first <= uVar1) && (uVar1 < ((reference)cur_1.idx)->second)) {
          poVar6 = std::operator<<((ostream *)&std::cout,"0x");
          pvVar7 = (void *)std::ostream::operator<<(poVar6,std::hex);
          dVar8 = pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator-
                            ((iterator *)&stack0xffffffffffeffe60,(iterator *)&cur.idx);
          pvVar7 = (void *)std::ostream::operator<<(pvVar7,loc + dVar8 * 8);
          poVar6 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
          std::operator<<(poVar6,"\n");
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::operator++(&__end4);
      }
      pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator++
                ((iterator *)&stack0xffffffffffeffe60);
    }
  }
  pstack::IOFlagSave::~IOFlagSave((IOFlagSave *)local_148);
  return;
}

Assistant:

inline void search(
        const Reader::csptr &view,
        const Matcher & m,
        Elf::Addr loc,
        const AddressRanges &searchaddrs,
        SymbolStore &store,
        bool showaddrs) {
    try {
        IOFlagSave _(cout);
        ReaderArray<Word, 131072> r(*view, 0);
        auto start = r.begin();
        if (searchaddrs.size()) {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                for (const auto &range : searchaddrs )
                    if (p >= range.first && p < range.second)
                        cout << "0x" << hex << loc + (cur - start) * sizeof( Word) << dec << "\n";
            }
        } else {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                if ( auto [ found, sym ] = store.find(p, m); found) {
                    if (showaddrs)
                        cout
                            << sym->name << " 0x" << std::hex << loc + (cur - start) * sizeof(Word)
                            << std::dec <<  " ... size=" << sym->sym.st_size
                            << ", diff=" << p - sym->memaddr() << endl;
#ifdef WITH_PYTHON
                    if (py) {
                        std::cout << "pyo " << Elf::Addr(loc) << " ";
                        py->print(Elf::Addr(loc) - sizeof (PyObject) +
                                sizeof (struct _typeobject *));
                        std::cout << "\n";
                    }
#endif
                    sym->count++;
                }
            }
        }
    } catch (const std::exception &ex) {
        std::clog << "warning: error reading data at " << std::hex << loc << std::dec << ": " << ex.what() << "\n";
    }
}